

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dec_api.c
# Opt level: O0

MPP_RET dummy_dec_parse(void *dec,HalDecTask *task)

{
  uint uVar1;
  int index_00;
  MppBufSlots slots_00;
  uint uVar2;
  RK_U32 replace_index;
  RK_S32 index;
  RK_U32 height;
  RK_U32 width;
  RK_S32 i;
  MppBufSlots slots;
  MppFrame pvStack_38;
  RK_U32 frame_count;
  MppFrame frame;
  void *pvStack_28;
  RK_S32 output;
  DummyDec *p;
  HalDecTask *task_local;
  void *dec_local;
  
  pvStack_38 = (MppFrame)0x0;
  p = (DummyDec *)task;
  task_local = (HalDecTask *)dec;
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"dummy_dec_api","found NULL intput\n","dummy_dec_parse");
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    slots_00 = *dec;
    uVar1 = *(uint *)((long)dec + 0x40);
    index = 0x500;
    replace_index = 0x2d0;
    pvStack_28 = dec;
    mpp_frame_init(&stack0xffffffffffffffc8);
    if (*(int *)((long)pvStack_28 + 0x3c) == 0) {
      mpp_buf_slot_setup(slots_00,0x10);
      *(undefined4 *)((long)pvStack_28 + 0x3c) = 1;
    }
    else if (1 < uVar1) {
      index = 0x780;
      replace_index = 0x440;
    }
    mpp_frame_set_width(pvStack_38,index);
    mpp_frame_set_height(pvStack_38,replace_index);
    mpp_frame_set_hor_stride(pvStack_38,index);
    mpp_frame_set_ver_stride(pvStack_38,replace_index);
    mpp_buf_slot_get_unused(slots_00,(RK_S32 *)((long)&frame + 4));
    mpp_buf_slot_set_flag(slots_00,frame._4_4_,SLOT_HAL_OUTPUT);
    *(RK_S32 *)((long)&p->task_pts + 4) = frame._4_4_;
    mpp_frame_set_pts(pvStack_38,*(RK_S64 *)((long)pvStack_28 + 0x30));
    mpp_buf_slot_set_prop(slots_00,frame._4_4_,SLOT_FRAME,pvStack_38);
    mpp_frame_deinit(&stack0xffffffffffffffc8);
    if ((pvStack_38 != (void *)0x0) &&
       (_mpp_log_l(2,"dummy_dec_api","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "((void*)0) == frame","dummy_dec_parse",0xee), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    memset(&p->task_eos,0xff,0x44);
    for (height = 0; (int)height < 2; height = height + 1) {
      index_00 = *(int *)((long)pvStack_28 + (long)(int)height * 4 + 0x48);
      if (-1 < index_00) {
        p->slot_index[(long)(int)height + -4] = index_00;
        mpp_buf_slot_set_flag(slots_00,index_00,SLOT_HAL_INPUT);
        mpp_buf_slot_set_flag(slots_00,index_00,SLOT_CODEC_USE);
      }
    }
    mpp_buf_slot_set_flag(slots_00,frame._4_4_,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots_00,frame._4_4_,QUEUE_DISPLAY);
    if (*(int *)((long)pvStack_28 + 0x38) == 0) {
      uVar2 = uVar1 & 1;
      if (-1 < *(int *)((long)pvStack_28 + (ulong)uVar2 * 4 + 0x48)) {
        mpp_buf_slot_clr_flag
                  (slots_00,*(RK_S32 *)((long)pvStack_28 + (ulong)uVar2 * 4 + 0x48),SLOT_CODEC_USE);
      }
      *(RK_S32 *)((long)pvStack_28 + (ulong)uVar2 * 4 + 0x48) = frame._4_4_;
      mpp_buf_slot_set_flag(slots_00,frame._4_4_,SLOT_CODEC_USE);
    }
    else {
      for (height = 0; (int)height < 2; height = height + 1) {
        mpp_buf_slot_clr_flag
                  (slots_00,*(RK_S32 *)((long)pvStack_28 + (long)(int)height * 4 + 0x48),
                   SLOT_CODEC_USE);
        *(undefined4 *)((long)pvStack_28 + (long)(int)height * 4 + 0x48) = 0xffffffff;
      }
    }
    *(uint *)((long)pvStack_28 + 0x40) = uVar1 + 1;
    dec_local._4_4_ = MPP_OK;
  }
  return dec_local._4_4_;
}

Assistant:

MPP_RET dummy_dec_parse(void *dec, HalDecTask *task)
{
    DummyDec *p;
    RK_S32 output;
    MppFrame frame = NULL;
    RK_U32 frame_count;
    MppBufSlots slots;
    RK_S32 i;
    RK_U32 width, height;

    if (NULL == dec) {
        mpp_err_f("found NULL intput\n");
        return MPP_ERR_NULL_PTR;
    }
    p = (DummyDec *)dec;

    slots = p->frame_slots;
    frame_count = p->frame_count;

    width = DUMMY_DEC_FRAME_WIDTH;
    height = DUMMY_DEC_FRAME_HEIGHT;

    mpp_frame_init(&frame);

    if (!p->slots_inited) {
        mpp_buf_slot_setup(slots, DUMMY_DEC_FRAME_COUNT);
        p->slots_inited = 1;
    } else if (frame_count >= 2) {
        // do info change test
        width = DUMMY_DEC_FRAME_NEW_WIDTH;
        height = DUMMY_DEC_FRAME_NEW_HEIGHT;
    }

    mpp_frame_set_width(frame, width);
    mpp_frame_set_height(frame, height);
    mpp_frame_set_hor_stride(frame, MPP_ALIGN(width, 16));
    mpp_frame_set_ver_stride(frame, MPP_ALIGN(height, 16));

    /*
     * set slots information
     * 1. output index MUST be set
     * 2. get unused index for output if needed
     * 3. set output index as hal_input
     * 4. set frame information to output index
     * 5. if one frame can be display, it SHOULD be enqueued to display queue
     */
    mpp_buf_slot_get_unused(slots, &output);
    mpp_buf_slot_set_flag(slots, output, SLOT_HAL_OUTPUT);
    task->output = output;

    mpp_frame_set_pts(frame, p->task_pts);
    mpp_buf_slot_set_prop(slots, output, SLOT_FRAME, frame);
    mpp_frame_deinit(&frame);
    mpp_assert(NULL == frame);

    /*
     * setup output task
     * 1. valid flag MUST be set if need hardware to run once
     * 2. set output slot index
     * 3. set reference slot index
     */
    memset(&task->refer, -1, sizeof(task->refer));
    for (i = 0; i < DUMMY_DEC_REF_COUNT; i++) {
        RK_S32 index = p->slot_index[i];
        if (index >= 0) {
            task->refer[i] = index;
            mpp_buf_slot_set_flag(slots, index, SLOT_HAL_INPUT);
            mpp_buf_slot_set_flag(slots, index, SLOT_CODEC_USE);
        }
    }

    /*
     * update dpb status assuming that hw has decoded the frame
     */
    mpp_buf_slot_set_flag(slots, output, SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots, output, QUEUE_DISPLAY);

    // add new reference buffer
    if (p->task_eos) {
        for (i = 0; i < DUMMY_DEC_REF_COUNT; i++) {
            mpp_buf_slot_clr_flag(slots, p->slot_index[i], SLOT_CODEC_USE);
            p->slot_index[i] = -1;
        }
    } else {
        // clear unreference buffer
        RK_U32 replace_index = frame_count & 1;
        if (p->slot_index[replace_index] >= 0)
            mpp_buf_slot_clr_flag(slots, p->slot_index[replace_index], SLOT_CODEC_USE);

        p->slot_index[replace_index] = output;
        mpp_buf_slot_set_flag(slots, output, SLOT_CODEC_USE);
    }

    p->frame_count = ++frame_count;

    return MPP_OK;
}